

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O1

bool Js::EquivalentTypeSet::IsSubsetOf(EquivalentTypeSet *left,EquivalentTypeSet *right)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  
  if (left->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(left);
  }
  if (right->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(right);
  }
  if (right->count < left->count) {
    bVar9 = false;
  }
  else {
    bVar9 = left->count == 0;
    if (!bVar9) {
      uVar5 = 0;
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar4 = 0;
      do {
        bVar8 = (int)uVar4 < (int)(uint)right->count;
        if ((int)uVar4 < (int)(uint)right->count) {
          lVar6 = (long)(int)uVar4;
          lVar7 = lVar6 * 8;
          do {
            bVar2 = JITTypeHolderBase<Memory::Recycler>::operator<
                              ((left->types).ptr + uVar5,
                               (JITTypeHolderBase<Memory::Recycler> *)
                               ((long)&(((right->types).ptr)->t).ptr + lVar7));
            if (bVar2) {
              bVar8 = false;
              goto LAB_004135a9;
            }
            bVar2 = JITTypeHolderBase<Memory::Recycler>::operator==
                              ((left->types).ptr + uVar5,
                               (JITTypeHolderBase<Memory::Recycler> *)
                               ((long)&(((right->types).ptr)->t).ptr + lVar7));
            if (bVar2) {
              uVar4 = uVar4 + 1;
              break;
            }
            lVar6 = lVar6 + 1;
            uVar4 = uVar4 + 1;
            lVar7 = lVar7 + 8;
            bVar8 = lVar6 < (long)(ulong)right->count;
          } while (lVar6 < (long)(ulong)right->count);
        }
        if ((int)(uint)right->count < (int)uVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EquivalentTypeSet.cpp"
                                      ,0x77,"(j <= right->count)","j <= right->count");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
        bVar8 = (bool)(bVar8 | uVar4 != right->count);
LAB_004135a9:
        if (!bVar8) {
          return bVar9;
        }
        uVar5 = uVar5 + 1;
        bVar8 = uVar5 < left->count;
        bVar9 = !bVar8;
      } while (bVar8);
    }
  }
  return bVar9;
}

Assistant:

bool EquivalentTypeSet::IsSubsetOf(EquivalentTypeSet * left, EquivalentTypeSet * right)
{
    if (!left->GetSortedAndDuplicatesRemoved())
    {
        left->SortAndRemoveDuplicates();
    }
    if (!right->GetSortedAndDuplicatesRemoved())
    {
        right->SortAndRemoveDuplicates();
    }

    if (left->count > right->count)
    {
        return false;
    }

    // Try to find each left type in the right set.
    int j = 0;
    for (int i = 0; i < left->count; i++)
    {
        bool found = false;
        for (; j < right->count; j++)
        {
            if (left->types[i] < right->types[j])
            {
                // Didn't find the left type. Fail.
                return false;
            }
            if (left->types[i] == right->types[j])
            {
                // Found the left type. Continue to the next left/right pair.
                found = true;
                j++;
                break;
            }
        }
        Assert(j <= right->count);
        if (j == right->count && !found)
        {
            // Exhausted the right set without finding the current left type.
            return false;
        }
    }
    return true;
}